

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.c
# Opt level: O0

void adios2sysMD5_Append(adios2sysMD5 *md5,uchar *data,int length)

{
  int in_EDX;
  char *in_RSI;
  size_t unaff_retaddr;
  size_t dlen;
  undefined4 in_stack_00000010;
  
  if (in_EDX < 0) {
    strlen(in_RSI);
  }
  md5_append((md5_state_t *)CONCAT44(length,in_stack_00000010),(md5_byte_t *)dlen,unaff_retaddr);
  return;
}

Assistant:

void kwsysMD5_Append(kwsysMD5* md5, unsigned char const* data, int length)
{
  size_t dlen;
  if (length < 0) {
    dlen = strlen((char const*)data);
  } else {
    dlen = (size_t)length;
  }
  md5_append(&md5->md5_state, (md5_byte_t const*)data, dlen);
}